

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O2

void llvm::yaml::MappingTraits<llvm::DWARFYAML::PubSection>::mapping(IO *IO,PubSection *Section)

{
  void *Context;
  
  Context = yaml::IO::getContext(IO);
  yaml::IO::setContext(IO,Section);
  yaml::IO::mapRequired<llvm::DWARFYAML::InitialLength>(IO,"Length",&Section->Length);
  yaml::IO::mapRequired<unsigned_short>(IO,"Version",&Section->Version);
  yaml::IO::mapRequired<unsigned_int>(IO,"UnitOffset",&Section->UnitOffset);
  yaml::IO::mapRequired<unsigned_int>(IO,"UnitSize",&Section->UnitSize);
  yaml::IO::
  mapRequired<std::vector<llvm::DWARFYAML::PubEntry,std::allocator<llvm::DWARFYAML::PubEntry>>>
            (IO,"Entries",&Section->Entries);
  yaml::IO::setContext(IO,Context);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::PubSection>::mapping(
    IO &IO, DWARFYAML::PubSection &Section) {
  auto OldContext = IO.getContext();
  IO.setContext(&Section);

  IO.mapRequired("Length", Section.Length);
  IO.mapRequired("Version", Section.Version);
  IO.mapRequired("UnitOffset", Section.UnitOffset);
  IO.mapRequired("UnitSize", Section.UnitSize);
  IO.mapRequired("Entries", Section.Entries);

  IO.setContext(OldContext);
}